

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR COM_writepage(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  int *piVar3;
  __off_t _Var4;
  ssize_t sVar5;
  LispPTR __fd;
  LispPTR LVar6;
  uint uVar7;
  LispPTR LVar8;
  DLword *page;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);
    uVar7 = *args;
    if ((uVar7 & 0xfff0000) == 0xf0000) {
      __fd = uVar7 | 0xffff0000;
    }
    else if ((uVar7 & 0xfff0000) == 0xe0000) {
      __fd = uVar7 & 0xffff;
    }
    else {
      pLVar2 = NativeAligned4FromLAddr(uVar7);
      __fd = *pLVar2;
    }
    uVar7 = args[1];
    if ((uVar7 & 0xfff0000) == 0xf0000) {
      LVar6 = uVar7 | 0xffff0000;
    }
    else if ((uVar7 & 0xfff0000) == 0xe0000) {
      LVar6 = uVar7 & 0xffff;
    }
    else {
      pLVar2 = NativeAligned4FromLAddr(uVar7);
      LVar6 = *pLVar2;
    }
    page = Lisp_world + args[2];
    uVar7 = args[3];
    if ((uVar7 & 0xfff0000) == 0xf0000) {
      LVar8 = uVar7 | 0xffff0000;
    }
    else if ((uVar7 & 0xfff0000) == 0xe0000) {
      LVar8 = uVar7 & 0xffff;
    }
    else {
      pLVar2 = NativeAligned4FromLAddr(uVar7);
      LVar8 = *pLVar2;
    }
    do {
      alarm(TIMEOUT_TIME);
      piVar3 = __errno_location();
      do {
        *piVar3 = 0;
        _Var4 = lseek(__fd,(long)(int)(LVar6 << 9),0);
        if (_Var4 != -1) {
          alarm(0);
          uVar7 = (int)(LVar8 + 3) >> 2;
          word_swap_page(page,uVar7);
          do {
            alarm(TIMEOUT_TIME);
            do {
              *piVar3 = 0;
              sVar5 = write(__fd,page,(long)(int)LVar8);
              if (sVar5 != -1) {
                alarm(0);
                word_swap_page(page,uVar7);
                return 0x4c;
              }
            } while (*piVar3 == 4);
            alarm(0);
          } while (*piVar3 == 4);
          *Lisp_errno = *piVar3;
          word_swap_page(page,uVar7);
          return 0;
        }
      } while (*piVar3 == 4);
      alarm(0);
    } while (*piVar3 == 4);
    *Lisp_errno = *piVar3;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR COM_writepage(LispPTR *args)
{
  int fd;
  int npage;
  char *bufp;
  int count;
  ssize_t rval;
  off_t offval;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);

  fd = LispNumToCInt(args[0]);
  npage = LispNumToCInt(args[1]);
  bufp = (char *)NativeAligned2FromLAddr(args[2]);
  count = LispNumToCInt(args[3]);

sklp2:
  TIMEOUT(offval = lseek(fd, (npage * FDEV_PAGE_SIZE), SEEK_SET));
  if (offval == -1) {
    if (errno == EINTR) goto sklp2; /* interrupted; retry */
    *Lisp_errno = errno;
    return (NIL);
  }

/* OK to write the page. */

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */

wlp:
  TIMEOUT(rval = write(fd, bufp, count));
  if (rval == -1) {
    if (errno == EINTR) goto wlp; /* interrupted; retry */
    *Lisp_errno = errno;
#ifdef BYTESWAP
    word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */
    return (NIL);
  }

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */

  return (ATOM_T);
}